

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

bool __thiscall mapbox::detail::Earcut<unsigned_int>::isEar(Earcut<unsigned_int> *this,Node *ear)

{
  Node *p_00;
  Node *r;
  bool bVar1;
  Node *in_RSI;
  Earcut<unsigned_int> *in_RDI;
  double dVar2;
  Node *p;
  Node *c;
  Node *b;
  Node *a;
  Node *local_38;
  bool local_1;
  
  p_00 = in_RSI->prev;
  r = in_RSI->next;
  dVar2 = area(in_RDI,p_00,in_RSI,r);
  if (dVar2 < 0.0) {
    for (local_38 = in_RSI->next->next; local_38 != in_RSI->prev; local_38 = local_38->next) {
      bVar1 = pointInTriangle(in_RDI,p_00->x,p_00->y,in_RSI->x,in_RSI->y,r->x,r->y,local_38->x,
                              local_38->y);
      if ((bVar1) && (dVar2 = area(in_RDI,local_38->prev,local_38,local_38->next), 0.0 <= dVar2)) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Earcut<N>::isEar(Node* ear) {
    const Node* a = ear->prev;
    const Node* b = ear;
    const Node* c = ear->next;

    if (area(a, b, c) >= 0) return false; // reflex, can't be an ear

    // now make sure we don't have other points inside the potential ear
    Node* p = ear->next->next;

    while (p != ear->prev) {
        if (pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->next;
    }

    return true;
}